

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O3

int ldesencode(lua_State *L)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *s;
  ulong uVar4;
  ulong uVar5;
  ulong size;
  uint8_t tail [8];
  size_t textsz;
  uint32_t SK [32];
  uint8_t tmp [256];
  uint8_t local_1c8 [8];
  size_t local_1c0;
  uint32_t local_1b8 [32];
  char local_138 [264];
  
  des_key(L,local_1b8);
  local_1c0 = 0;
  pcVar3 = luaL_checklstring(L,2,&local_1c0);
  size = (local_1c0 & 0xfffffffffffffff8) + 8;
  if (size < 0x101) {
    s = local_138;
  }
  else {
    s = (char *)lua_newuserdata(L,size);
  }
  uVar4 = 0;
  iVar1 = (int)local_1c0;
  if (7 < iVar1) {
    uVar4 = 0;
    do {
      des_crypt(local_1b8,(uint8_t *)(pcVar3 + uVar4),(uint8_t *)(s + uVar4));
      uVar4 = uVar4 + 8;
      iVar1 = (int)local_1c0;
    } while ((long)uVar4 < (long)(iVar1 + -7));
  }
  uVar2 = iVar1 - (int)uVar4;
  uVar5 = 0;
  do {
    if ((long)uVar5 < (long)(int)uVar2) {
      local_1c8[uVar5] = pcVar3[uVar5 + (uVar4 & 0xffffffff)];
    }
    else if (uVar2 == uVar5) {
      local_1c8[uVar2] = 0x80;
    }
    else {
      local_1c8[uVar5] = '\0';
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 8);
  des_crypt(local_1b8,local_1c8,(uint8_t *)(s + (uVar4 & 0xffffffff)));
  lua_pushlstring(L,s,size);
  return 1;
}

Assistant:

static int
ldesencode(lua_State *L) {
	uint32_t SK[32];
	des_key(L, SK);

	size_t textsz = 0;
	const uint8_t * text = (const uint8_t *)luaL_checklstring(L, 2, &textsz);
	size_t chunksz = (textsz + 8) & ~7;
	uint8_t tmp[SMALL_CHUNK];
	uint8_t *buffer = tmp;
	if (chunksz > SMALL_CHUNK) {
		buffer = lua_newuserdata(L, chunksz);
	}
	int i;
	for (i=0;i<(int)textsz-7;i+=8) {
		des_crypt(SK, text+i, buffer+i);
	}
	int bytes = textsz - i;
	uint8_t tail[8];
	int j;
	for (j=0;j<8;j++) {
		if (j < bytes) {
			tail[j] = text[i+j];
		} else if (j==bytes) {
			tail[j] = 0x80;
		} else {
			tail[j] = 0;
		}
	}
	des_crypt(SK, tail, buffer+i);
	lua_pushlstring(L, (const char *)buffer, chunksz);

	return 1;
}